

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processestimator.cxx
# Opt level: O3

void __thiscall ProcessEstimator::~ProcessEstimator(ProcessEstimator *this)

{
  uint uVar1;
  double **ppdVar2;
  ulong uVar3;
  
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ProcessEstimator_0015dc70;
  if (this->aSample != (double *)0x0) {
    operator_delete__(this->aSample);
  }
  if (this->aOne != (double *)0x0) {
    operator_delete__(this->aOne);
  }
  if (this->aTwo != (double *)0x0) {
    operator_delete__(this->aTwo);
  }
  if ((this->aThree != (double *)0x0) && (this->aTwo != (double *)0x0)) {
    operator_delete__(this->aTwo);
  }
  ppdVar2 = this->aDist;
  if (ppdVar2 != (double **)0x0) {
    uVar1 = this->nLength;
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        if (this->aDist[uVar3] != (double *)0x0) {
          operator_delete__(this->aDist[uVar3]);
          uVar1 = this->nLength;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar1);
      ppdVar2 = this->aDist;
    }
    operator_delete(ppdVar2,8);
  }
  Estimator::~Estimator(&this->super_Estimator);
  return;
}

Assistant:

ProcessEstimator::~ProcessEstimator()
{
    delete[] aSample;
	if(aOne) delete[] aOne;
	if(aTwo) delete[] aTwo;
	if(aThree) delete[] aTwo;
	if(aDist) {
		for(uint i=0; i<nLength; i++)
			delete[] aDist[i];
		delete aDist;
	}
}